

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  int iVar1;
  value_type *pvVar2;
  ImDrawChannel *this_00;
  value_type *pvVar3;
  value_type *ppvVar4;
  bool bVar5;
  undefined1 local_60 [8];
  ImDrawCmd draw_cmd;
  int local_1c;
  int i;
  int old_channels_count;
  int channels_count_local;
  ImDrawList *this_local;
  
  bVar5 = false;
  if (this->_ChannelsCurrent == 0) {
    bVar5 = this->_ChannelsCount == 1;
  }
  if (!bVar5) {
    __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x114,"void ImDrawList::ChannelsSplit(int)");
  }
  iVar1 = (this->_Channels).Size;
  if (iVar1 < channels_count) {
    ImVector<ImDrawChannel>::resize(&this->_Channels,channels_count);
  }
  this->_ChannelsCount = channels_count;
  pvVar2 = ImVector<ImDrawChannel>::operator[](&this->_Channels,0);
  memset(pvVar2,0,0x20);
  for (local_1c = 1; local_1c < channels_count; local_1c = local_1c + 1) {
    if (local_1c < iVar1) {
      pvVar2 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_1c);
      ImVector<ImDrawCmd>::resize(&pvVar2->CmdBuffer,0);
      pvVar2 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_1c);
      ImVector<unsigned_short>::resize(&pvVar2->IdxBuffer,0);
    }
    else {
      ImVector<ImDrawChannel>::operator[](&this->_Channels,local_1c);
      this_00 = (ImDrawChannel *)operator_new(0x20);
      (this_00->IdxBuffer).Size = 0;
      (this_00->IdxBuffer).Capacity = 0;
      (this_00->IdxBuffer).Data = (unsigned_short *)0x0;
      (this_00->CmdBuffer).Size = 0;
      (this_00->CmdBuffer).Capacity = 0;
      (this_00->CmdBuffer).Data = (ImDrawCmd *)0x0;
      ImDrawChannel::ImDrawChannel(this_00);
    }
    pvVar2 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_1c);
    if ((pvVar2->CmdBuffer).Size == 0) {
      ImDrawCmd::ImDrawCmd((ImDrawCmd *)local_60);
      pvVar3 = ImVector<ImVec4>::back(&this->_ClipRectStack);
      local_60._4_4_ = pvVar3->x;
      unique0x00012004 = pvVar3->y;
      draw_cmd.ClipRect.x = pvVar3->z;
      draw_cmd.ClipRect.y = pvVar3->w;
      ppvVar4 = ImVector<void_*>::back(&this->_TextureIdStack);
      draw_cmd._16_8_ = *ppvVar4;
      pvVar2 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_1c);
      ImVector<ImDrawCmd>::push_back(&pvVar2->CmdBuffer,(value_type *)local_60);
    }
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}